

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messagebox.cpp
# Opt level: O3

void __thiscall QtMWidgets::MsgBoxTitlePrivate::prepareTitle(MsgBoxTitlePrivate *this)

{
  long lVar1;
  QArrayData *pQVar2;
  char16_t *pcVar3;
  qsizetype qVar4;
  int iVar5;
  int extraout_EDX;
  QLatin1String QVar6;
  QRect r;
  undefined1 local_58 [16];
  qsizetype local_48;
  ulong local_40;
  undefined8 local_38;
  
  lVar1 = *(long *)&this->q->field_0x20;
  local_40 = (ulong)(uint)this->margin;
  local_38 = CONCAT44(*(int *)(lVar1 + 0x20) - *(int *)(lVar1 + 0x18),
                      *(int *)(lVar1 + 0x1c) - (*(int *)(lVar1 + 0x14) + this->margin));
  QFontMetrics::QFontMetrics((QFontMetrics *)local_58,(QFont *)(lVar1 + 0x38));
  iVar5 = QFontMetrics::boundingRect
                    ((QRect *)local_58,(int)&local_40,(QString *)0x1,(int)&this->title,(int *)0x0);
  QFontMetrics::~QFontMetrics((QFontMetrics *)local_58);
  QString::operator=(&this->preparedTitle,&this->title);
  if (((int)local_38 - (int)local_40) + 1 < (extraout_EDX - iVar5) + 1) {
    QFontMetrics::QFontMetrics
              ((QFontMetrics *)local_58,(QFont *)(*(long *)&this->q->field_0x20 + 0x38));
    QFontMetrics::averageCharWidth();
    QFontMetrics::~QFontMetrics((QFontMetrics *)local_58);
    QString::left((longlong)local_58);
    pQVar2 = &((this->preparedTitle).d.d)->super_QArrayData;
    pcVar3 = (this->preparedTitle).d.ptr;
    (this->preparedTitle).d.d = (Data *)local_58._0_8_;
    (this->preparedTitle).d.ptr = (char16_t *)local_58._8_8_;
    qVar4 = (this->preparedTitle).d.size;
    (this->preparedTitle).d.size = local_48;
    local_58._0_8_ = pQVar2;
    local_58._8_8_ = pcVar3;
    local_48 = qVar4;
    if (pQVar2 != (QArrayData *)0x0) {
      LOCK();
      (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar2,2,8);
      }
    }
    QVar6.m_data = (char *)0x3;
    QVar6.m_size = (qsizetype)&this->preparedTitle;
    QString::append(QVar6);
  }
  return;
}

Assistant:

void
MsgBoxTitlePrivate::prepareTitle()
{
	const QRect r = q->rect().marginsRemoved( QMargins( margin, 0,
		margin, 0 ) );

	const QRect & b = q->fontMetrics().boundingRect( r,
		Qt::AlignLeft, title );

	preparedTitle = title;

	if( b.width() > r.width() )
	{
		const int averageCount = r.width() / q->fontMetrics().averageCharWidth();

		preparedTitle = title.left( averageCount - 3 );
		preparedTitle.append( QLatin1String( "..." ) );
	}
}